

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O2

void Handlers::StatSkill_Open(Character *character,PacketReader *reader)

{
  pointer ppNVar1;
  NPC *this;
  size_type sVar2;
  pointer puVar3;
  unsigned_short uVar4;
  NPC_Data *pNVar5;
  unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_> *skill;
  pointer ppNVar6;
  pointer puVar7;
  allocator local_79;
  string local_78;
  PacketBuilder reply;
  
  uVar4 = PacketReader::GetShort(reader);
  ppNVar6 = (character->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar1 = (character->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppNVar6 == ppNVar1) {
      return;
    }
    this = *ppNVar6;
    if ((this->index == uVar4) &&
       (pNVar5 = NPC::Data(this),
       (pNVar5->skill_learn).
       super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish !=
       (pNVar5->skill_learn).
       super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)) break;
    ppNVar6 = ppNVar6 + 1;
  }
  character->npc = this;
  character->npc_type = Skills;
  pNVar5 = NPC::Data(this);
  sVar2 = (pNVar5->skill_name)._M_string_length;
  pNVar5 = NPC::Data(this);
  PacketBuilder::PacketBuilder
            (&reply,PACKET_STATSKILL,PACKET_OPEN,
             sVar2 + ((long)(pNVar5->skill_learn).
                            super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pNVar5->skill_learn).
                            super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x1c + 2);
  PacketBuilder::AddShort(&reply,(unsigned_short)this->id);
  pNVar5 = NPC::Data(this);
  std::__cxx11::string::string((string *)&local_78,(pNVar5->skill_name)._M_dataplus._M_p,&local_79);
  PacketBuilder::AddBreakString(&reply,&local_78,0xff);
  std::__cxx11::string::~string((string *)&local_78);
  pNVar5 = NPC::Data(this);
  puVar3 = (pNVar5->skill_learn).
           super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (pNVar5->skill_learn).
                super__Vector_base<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>,_std::allocator<std::unique_ptr<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3; puVar7 = puVar7 + 1) {
    PacketBuilder::AddShort
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->id);
    PacketBuilder::AddChar
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->levelreq);
    PacketBuilder::AddChar
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->classreq);
    PacketBuilder::AddInt
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->cost);
    PacketBuilder::AddShort
              (&reply,(((puVar7->_M_t).
                        super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                        .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->skillreq).
                      _M_elems[0]);
    PacketBuilder::AddShort
              (&reply,*(short *)((long)(((puVar7->_M_t).
                                         super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                         .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>.
                                        _M_head_impl)->skillreq)._M_elems + 2));
    PacketBuilder::AddShort
              (&reply,*(short *)((long)(((puVar7->_M_t).
                                         super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                         .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>.
                                        _M_head_impl)->skillreq)._M_elems + 4));
    PacketBuilder::AddShort
              (&reply,*(short *)((long)(((puVar7->_M_t).
                                         super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                                         .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>.
                                        _M_head_impl)->skillreq)._M_elems + 6));
    PacketBuilder::AddShort
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->strreq);
    PacketBuilder::AddShort
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->wisreq);
    PacketBuilder::AddShort
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->intreq);
    PacketBuilder::AddShort
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->agireq);
    PacketBuilder::AddShort
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->conreq);
    PacketBuilder::AddShort
              (&reply,((puVar7->_M_t).
                       super___uniq_ptr_impl<NPC_Learn_Skill,_std::default_delete<NPC_Learn_Skill>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NPC_Learn_Skill_*,_std::default_delete<NPC_Learn_Skill>_>
                       .super__Head_base<0UL,_NPC_Learn_Skill_*,_false>._M_head_impl)->chareq);
  }
  Character::Send(character,&reply);
  PacketBuilder::~PacketBuilder(&reply);
  return;
}

Assistant:

void StatSkill_Open(Character *character, PacketReader &reader)
	{
		short id = reader.GetShort();

		UTIL_FOREACH(character->map->npcs, npc)
		{
			if (npc->index == id && npc->Data().skill_learn.size() > 0)
			{
				character->npc = npc;
				character->npc_type = ENF::Skills;

				PacketBuilder reply(PACKET_STATSKILL, PACKET_OPEN, 2 + npc->Data().skill_name.length() + npc->Data().skill_learn.size() * 28);
				reply.AddShort(npc->id);
				reply.AddBreakString(npc->Data().skill_name.c_str());

				UTIL_FOREACH_CREF(npc->Data().skill_learn, skill)
				{
					reply.AddShort(skill->id);
					reply.AddChar(skill->levelreq);
					reply.AddChar(skill->classreq);
					reply.AddInt(skill->cost);
					reply.AddShort(skill->skillreq[0]);
					reply.AddShort(skill->skillreq[1]);
					reply.AddShort(skill->skillreq[2]);
					reply.AddShort(skill->skillreq[3]);
					reply.AddShort(skill->strreq);
					reply.AddShort(skill->wisreq);
					reply.AddShort(skill->intreq);
					reply.AddShort(skill->agireq);
					reply.AddShort(skill->conreq);
					reply.AddShort(skill->chareq);
				}

				character->Send(reply);

				break;
			}
		}
	}